

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

SequenceRange
slang::ast::SequenceRange::fromSyntax
          (RangeSelectSyntax *syntax,ASTContext *context,bool allowUnbounded)

{
  Type *this;
  bool bVar1;
  int iVar2;
  optional<int> oVar3;
  undefined4 extraout_var;
  Type *pTVar4;
  Diagnostic *this_00;
  _Storage<int,_true> _Var5;
  undefined4 uVar6;
  SourceRange SVar7;
  SequenceRange SVar8;
  _Storage<int,_true> local_48;
  _Storage<int,_true> _Stack_44;
  long local_38;
  
  local_48._M_value = 1;
  oVar3 = ASTContext::evalInteger(context,(syntax->left).ptr,(bitmask<slang::ast::ASTFlags>)0x80000)
  ;
  SVar7 = slang::syntax::SyntaxNode::sourceRange(&((syntax->left).ptr)->super_SyntaxNode);
  bVar1 = ASTContext::requirePositive(context,oVar3,SVar7);
  _Var5._M_value =
       oVar3.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
       _M_payload;
  if (bVar1) {
    local_48._M_value = _Var5._M_value;
  }
  iVar2 = Expression::bind((int)(syntax->right).ptr,(sockaddr *)context,
                           (uint)allowUnbounded << 9 | 0x90000);
  this = (((Expression *)CONCAT44(extraout_var,iVar2))->type).ptr;
  pTVar4 = this->canonical;
  if (pTVar4 == (Type *)0x0) {
    Type::resolveCanonical(this);
    pTVar4 = this->canonical;
  }
  if ((pTVar4->super_Symbol).kind == UnboundedType) {
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    oVar3 = ASTContext::evalInteger
                      (context,(Expression *)CONCAT44(extraout_var,iVar2),
                       (bitmask<slang::ast::EvalFlags>)0x0);
    SVar7 = slang::syntax::SyntaxNode::sourceRange(&((syntax->right).ptr)->super_SyntaxNode);
    bVar1 = ASTContext::requirePositive(context,oVar3,SVar7);
    if (bVar1) {
      _Stack_44._M_value =
           oVar3.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
           _M_payload;
      uVar6 = 1;
      if (_Stack_44._M_value < _Var5._M_value) {
        SVar7 = slang::syntax::SyntaxNode::sourceRange(&((syntax->left).ptr)->super_SyntaxNode);
        this_00 = ASTContext::addDiag(context,(DiagCode)0x460008,SVar7);
        SVar7 = slang::syntax::SyntaxNode::sourceRange(&((syntax->right).ptr)->super_SyntaxNode);
        Diagnostic::operator<<(this_00,SVar7);
        local_38 = (long)_Var5._M_value;
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::emplace_back<long>(&this_00->args,&local_38);
        local_38 = (long)_Stack_44._M_value;
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::emplace_back<long>(&this_00->args,&local_38);
      }
    }
  }
  SVar8.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_payload =
       (_Storage<unsigned_int,_true>)_Stack_44._M_value;
  SVar8.min = local_48._M_value;
  SVar8.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._4_4_ = uVar6;
  return SVar8;
}

Assistant:

SequenceRange SequenceRange::fromSyntax(const RangeSelectSyntax& syntax, const ASTContext& context,
                                        bool allowUnbounded) {
    SequenceRange range;
    auto l = context.evalInteger(*syntax.left, ASTFlags::AssertionDelayOrRepetition);
    if (context.requirePositive(l, syntax.left->sourceRange()))
        range.min = uint32_t(*l);

    // The rhs can be an unbounded '$' so we need extra AST flags.
    bitmask<ASTFlags> flags = ASTFlags::AssertionExpr | ASTFlags::AssertionDelayOrRepetition;
    if (allowUnbounded)
        flags |= ASTFlags::AllowUnboundedLiteral;

    auto& re = Expression::bind(*syntax.right, context, flags);
    if (re.type->isUnbounded())
        return range;

    auto r = context.evalInteger(re);
    if (context.requirePositive(r, syntax.right->sourceRange())) {
        range.max = uint32_t(*r);
        if (*l > *r) {
            auto& diag = context.addDiag(diag::SeqRangeMinMax, syntax.left->sourceRange());
            diag << syntax.right->sourceRange();
            diag << *l << *r;
        }
    }

    return range;
}